

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

char * __thiscall FString::LockNewBuffer(FString *this,size_t len)

{
  FStringData *pFVar1;
  
  FStringData::Release((FStringData *)(this->Chars + -0xc));
  pFVar1 = FStringData::Alloc(len);
  this->Chars = (char *)(pFVar1 + 1);
  pFVar1->Len = (uint)len;
  if (pFVar1->RefCount == 1) {
    pFVar1->RefCount = -1;
    return (char *)(pFVar1 + 1);
  }
  __assert_fail("Data()->RefCount == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                ,0xa3,"char *FString::LockNewBuffer(size_t)");
}

Assistant:

char *FString::LockNewBuffer(size_t len)
{
	Data()->Release();
	AllocBuffer(len);
	assert(Data()->RefCount == 1);
	Data()->RefCount = -1;
	return Chars;
}